

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O3

void __thiscall
cappuccino::
tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_update(tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            *this,iterator keyed_position,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
           time_point expire_time)

{
  pointer peVar1;
  iterator iVar2;
  __off64_t *in_R8;
  size_t in_R9;
  size_t element_idx;
  uint __flags;
  unsigned_long uVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  
  uVar3 = *(unsigned_long *)
           ((long)keyed_position.
                  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                  _M_cur + 0x10);
  peVar1 = (this->m_elements).
           super__Vector_base<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar3;
  (peVar1->m_expire_time).__d.__r = (rep)expire_time.__d.__r;
  local_30.__d.__r = expire_time.__d.__r;
  std::__cxx11::string::operator=((string *)&peVar1->m_value,(string *)value);
  __flags = (uint)uVar3;
  std::
  _Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
  ::erase_abi_cxx11_((_Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
                      *)&this->m_ttl_list,(peVar1->m_ttl_position)._M_node);
  iVar2 = std::
          _Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
          ::
          _M_emplace_equal<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,unsigned_long&>
                    ((_Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
                      *)&this->m_ttl_list,&local_30,(unsigned_long *)&stack0xffffffffffffffc8);
  (peVar1->m_ttl_position)._M_node = iVar2._M_node;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
            (&this->m_lru_list,
             (int)(this->m_lru_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl._M_node.super__List_node_base._M_next,(__off64_t *)&this->m_lru_list,
             (int)(peVar1->m_lru_position)._M_node,in_R8,in_R9,__flags);
  return;
}

Assistant:

auto do_update(
        typename std::unordered_map<key_type, size_t>::iterator keyed_position,
        value_type&&                                            value,
        std::chrono::steady_clock::time_point                   expire_time) -> void
    {
        size_t element_idx = keyed_position->second;

        element& e      = m_elements[element_idx];
        e.m_expire_time = expire_time;
        e.m_value       = std::move(value);

        // Reinsert into TTL list with the new TTL.
        m_ttl_list.erase(e.m_ttl_position);
        e.m_ttl_position = m_ttl_list.emplace(expire_time, element_idx);

        do_access(e);
    }